

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConstantPattern * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConstantPattern,slang::ast::Expression_const&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,SourceRange *args_1)

{
  SourceRange sourceRange;
  ConstantPattern *pCVar1;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pCVar1 = (ConstantPattern *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::ConstantPattern::ConstantPattern
            (*(ConstantPattern **)((long)in_RDX + 8),*(Expression **)in_RDX,sourceRange);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }